

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view_catalog_entry.cpp
# Opt level: O2

unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true> __thiscall
duckdb::ViewCatalogEntry::AlterEntry(ViewCatalogEntry *this,ClientContext *context,AlterInfo *info)

{
  __type _Var1;
  reference __lhs;
  pointer pCVar2;
  reference this_00;
  BinderException *this_01;
  CatalogException *this_02;
  InternalException *this_03;
  long in_RCX;
  size_t *this_04;
  ulong __n;
  allocator_type local_91;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (*(char *)(in_RCX + 9) == '\x02') {
    if (*(char *)(in_RCX + 0x71) != '\x01') {
      this_03 = (InternalException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_90,"Unrecognized alter view type!",(allocator *)&local_91);
      InternalException::InternalException(this_03,&local_90);
      __cxa_throw(this_03,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    (**(code **)&(((context->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.
                   internal.super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->config).home_directory._M_dataplus)(this,context);
    pCVar2 = unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>::
             operator->((unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>
                         *)this);
    ::std::__cxx11::string::_M_assign((string *)&pCVar2->name);
  }
  else {
    if (*(char *)(in_RCX + 9) != '\b') {
      this_02 = (CatalogException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_90,"Can only modify view with ALTER VIEW statement",
                 (allocator *)&local_91);
      CatalogException::CatalogException(this_02,&local_90);
      __cxa_throw(this_02,&CatalogException::typeinfo,::std::runtime_error::~runtime_error);
    }
    (**(code **)&(((context->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.
                   internal.super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->config).home_directory._M_dataplus)(this,context);
    __n = 0;
    while( true ) {
      if ((ulong)((long)((context->config).set_variables._M_h._M_element_count -
                        (long)(context->config).set_variables._M_h._M_before_begin._M_nxt) >> 5) <=
          __n) {
        this_01 = (BinderException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&local_90,"View \"%s\" does not have a column with name \"%s\"",
                   (allocator *)&local_91);
        ::std::__cxx11::string::string((string *)&local_50,(string *)&context->interrupted);
        ::std::__cxx11::string::string((string *)&local_70,(string *)(in_RCX + 0x78));
        BinderException::BinderException<std::__cxx11::string,std::__cxx11::string>
                  (this_01,&local_90,&local_50,&local_70);
        __cxa_throw(this_01,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
      __lhs = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              ::get<true>((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                           *)&(context->config).set_variables._M_h._M_before_begin,__n);
      _Var1 = ::std::operator==(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)(in_RCX + 0x78));
      if (_Var1) break;
      __n = __n + 1;
    }
    pCVar2 = unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>::
             operator->((unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>
                         *)this);
    this_04 = &pCVar2[1].tags._M_h._M_rehash_policy._M_next_resize;
    if ((__node_base_ptr)pCVar2[1].tags._M_h._M_rehash_policy._M_next_resize ==
        pCVar2[1].tags._M_h._M_single_bucket) {
      ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::vector
                ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_90,
                 ((long)pCVar2[1].tags._M_h._M_buckets -
                 (long)pCVar2[1].comment.value_info_.internal.
                       super___shared_ptr<duckdb::ExtraValueInfo,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi) / 0x18,&local_91);
      ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::_M_move_assign
                ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)this_04,&local_90);
      ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
                ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_90);
    }
    this_00 = vector<duckdb::Value,_true>::get<true>((vector<duckdb::Value,_true> *)this_04,__n);
    Value::operator=(this_00,(Value *)(in_RCX + 0x98));
  }
  return (unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>)
         (unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>)this;
}

Assistant:

unique_ptr<CatalogEntry> ViewCatalogEntry::AlterEntry(ClientContext &context, AlterInfo &info) {
	D_ASSERT(!internal);

	// Column comments have a special alter type
	if (info.type == AlterType::SET_COLUMN_COMMENT) {
		auto &comment_on_column_info = info.Cast<SetColumnCommentInfo>();
		auto copied_view = Copy(context);

		for (idx_t i = 0; i < names.size(); i++) {
			const auto &col_name = names[i];
			if (col_name == comment_on_column_info.column_name) {
				auto &copied_view_entry = copied_view->Cast<ViewCatalogEntry>();

				// If vector is empty, we need to initialize it on setting here
				if (copied_view_entry.column_comments.empty()) {
					copied_view_entry.column_comments = vector<Value>(copied_view_entry.types.size());
				}

				copied_view_entry.column_comments[i] = comment_on_column_info.comment_value;
				return copied_view;
			}
		}
		throw BinderException("View \"%s\" does not have a column with name \"%s\"", name,
		                      comment_on_column_info.column_name);
	}

	if (info.type != AlterType::ALTER_VIEW) {
		throw CatalogException("Can only modify view with ALTER VIEW statement");
	}
	auto &view_info = info.Cast<AlterViewInfo>();
	switch (view_info.alter_view_type) {
	case AlterViewType::RENAME_VIEW: {
		auto &rename_info = view_info.Cast<RenameViewInfo>();
		auto copied_view = Copy(context);
		copied_view->name = rename_info.new_view_name;
		return copied_view;
	}
	default:
		throw InternalException("Unrecognized alter view type!");
	}
}